

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O0

int __thiscall
CVmObjIterIdx::getp_get_cur_key(CVmObjIterIdx *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  long lVar2;
  long lVar3;
  vm_val_t *in_RDX;
  vm_val_t *in_RDI;
  long idx;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  uint *in_stack_ffffffffffffffb0;
  long lVar4;
  
  if ((getp_get_cur_key(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_cur_key(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_cur_key::desc,0);
    __cxa_guard_release(&getp_get_cur_key(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(in_RDI,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
  ;
  if (iVar1 == 0) {
    lVar2 = get_cur_index((CVmObjIterIdx *)0x312792);
    if ((lVar2 < 1) ||
       (lVar4 = lVar2, lVar3 = get_last_valid((CVmObjIterIdx *)0x3127b3), lVar3 < lVar4)) {
      err_throw(0);
    }
    vm_val_t::set_int(in_RDX,(int32_t)lVar2);
  }
  return 1;
}

Assistant:

int CVmObjIterIdx::getp_get_cur_key(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                    uint *argc)
{
    long idx;
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the current index */
    idx = get_cur_index();

    /* if the current value is out of range, throw an error */
    if (idx < 1 || idx > get_last_valid())
        err_throw(VMERR_OUT_OF_RANGE);

    /* return the index */
    retval->set_int(idx);

    /* handled */
    return TRUE;
}